

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetCentroidCount
          (VClient *this,string *i_rCameraName,uint *o_rCount)

{
  Enum EVar1;
  bool bVar2;
  VCameraInfo *pVVar3;
  VCentroids *pVVar4;
  Enum GetResult;
  scoped_lock Lock;
  Enum local_2c;
  unique_lock<boost::recursive_mutex> local_28;
  
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&local_28,&this->m_FrameMutex);
  local_2c = Success;
  bVar2 = InitGet<unsigned_int>(this,&local_2c,o_rCount);
  if (bVar2) {
    pVVar3 = GetCamera(this,i_rCameraName,&local_2c);
    if (pVVar3 != (VCameraInfo *)0x0) {
      pVVar4 = GetCentroidSet(this,pVVar3->m_CameraID,&local_2c);
      if (pVVar4 != (VCentroids *)0x0) {
        *o_rCount = (uint)((ulong)((long)(pVVar4->m_Centroids).
                                         super__Vector_base<ViconCGStreamDetail::VCentroids_Centroid,_std::allocator<ViconCGStreamDetail::VCentroids_Centroid>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pVVar4->m_Centroids).
                                        super__Vector_base<ViconCGStreamDetail::VCentroids_Centroid,_std::allocator<ViconCGStreamDetail::VCentroids_Centroid>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 5);
      }
    }
  }
  EVar1 = local_2c;
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&local_28);
  return EVar1;
}

Assistant:

Result::Enum VClient::GetCentroidCount( const std::string & i_rCameraName, unsigned int & o_rCount ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Result::Enum GetResult = Result::Success;
  if( InitGet( GetResult, o_rCount ) )
  {
    const ViconCGStream::VCameraInfo* pCamera = GetCamera( i_rCameraName, GetResult );
    if( !pCamera )
    {
      return GetResult;
    }

    const ViconCGStream::VCentroids* pCentroidSet = GetCentroidSet( pCamera->m_CameraID, GetResult );
    if( pCentroidSet )
    {
      o_rCount = static_cast< unsigned int >( pCentroidSet->m_Centroids.size() );
    }
  }
  return GetResult;
}